

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int llex(LexState *ls,SemInfo *seminfo)

{
  size_t sVar1;
  ushort uVar2;
  ZIO *pZVar3;
  byte *pbVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ushort **ppuVar9;
  TString *pTVar10;
  char *msg;
  int c;
  
  ls->buff->n = 0;
LAB_0010ad28:
  do {
    uVar5 = ls->current;
    while( true ) {
      if (uVar5 == 0xffffffff) {
        return 0x11f;
      }
      if (uVar5 == 10) break;
      if (uVar5 == 0x7e) {
        pZVar3 = ls->z;
        sVar1 = pZVar3->n;
        pZVar3->n = pZVar3->n - 1;
        if (sVar1 == 0) {
          uVar5 = luaZ_fill(pZVar3);
        }
        else {
          pbVar4 = (byte *)pZVar3->p;
          pZVar3->p = (char *)(pbVar4 + 1);
          uVar5 = (uint)*pbVar4;
        }
        ls->current = uVar5;
        if (uVar5 != 0x3d) {
          return 0x7e;
        }
        pZVar3 = ls->z;
        sVar1 = pZVar3->n;
        pZVar3->n = pZVar3->n - 1;
        if (sVar1 == 0) {
          uVar5 = luaZ_fill(pZVar3);
        }
        else {
          pbVar4 = (byte *)pZVar3->p;
          pZVar3->p = (char *)(pbVar4 + 1);
          uVar5 = (uint)*pbVar4;
        }
        ls->current = uVar5;
        return 0x11b;
      }
      if ((uVar5 == 0x22) || (uVar5 == 0x27)) {
        save(ls,uVar5);
        pZVar3 = ls->z;
        sVar1 = pZVar3->n;
        pZVar3->n = pZVar3->n - 1;
        if (sVar1 == 0) {
          uVar8 = luaZ_fill(pZVar3);
        }
        else {
          pbVar4 = (byte *)pZVar3->p;
          pZVar3->p = (char *)(pbVar4 + 1);
          uVar8 = (uint)*pbVar4;
        }
        ls->current = uVar8;
        goto LAB_0010af33;
      }
      if (uVar5 == 0x2d) {
        pZVar3 = ls->z;
        sVar1 = pZVar3->n;
        pZVar3->n = pZVar3->n - 1;
        if (sVar1 == 0) {
          uVar5 = luaZ_fill(pZVar3);
        }
        else {
          pbVar4 = (byte *)pZVar3->p;
          pZVar3->p = (char *)(pbVar4 + 1);
          uVar5 = (uint)*pbVar4;
        }
        ls->current = uVar5;
        if (uVar5 != 0x2d) {
          return 0x2d;
        }
        pZVar3 = ls->z;
        sVar1 = pZVar3->n;
        pZVar3->n = pZVar3->n - 1;
        if (sVar1 == 0) {
          uVar5 = luaZ_fill(pZVar3);
        }
        else {
          pbVar4 = (byte *)pZVar3->p;
          pZVar3->p = (char *)(pbVar4 + 1);
          uVar5 = (uint)*pbVar4;
        }
        ls->current = uVar5;
        if (uVar5 != 0x5b) goto LAB_0010ae8b;
        iVar6 = skip_sep(ls);
        ls->buff->n = 0;
        if (iVar6 < 0) {
          uVar5 = ls->current;
LAB_0010ae8b:
          while ((0xe < uVar5 + 1 || ((0x4801U >> (uVar5 + 1 & 0x1f) & 1) == 0))) {
            pZVar3 = ls->z;
            sVar1 = pZVar3->n;
            pZVar3->n = pZVar3->n - 1;
            if (sVar1 == 0) {
              uVar5 = luaZ_fill(pZVar3);
            }
            else {
              pbVar4 = (byte *)pZVar3->p;
              pZVar3->p = (char *)(pbVar4 + 1);
              uVar5 = (uint)*pbVar4;
            }
            ls->current = uVar5;
          }
        }
        else {
          read_long_string(ls,(SemInfo *)0x0,iVar6);
          ls->buff->n = 0;
        }
        goto LAB_0010ad28;
      }
      if (uVar5 == 0x2e) {
        save(ls,0x2e);
        pZVar3 = ls->z;
        sVar1 = pZVar3->n;
        pZVar3->n = pZVar3->n - 1;
        if (sVar1 == 0) {
          uVar5 = luaZ_fill(pZVar3);
        }
        else {
          pbVar4 = (byte *)pZVar3->p;
          pZVar3->p = (char *)(pbVar4 + 1);
          uVar5 = (uint)*pbVar4;
        }
        ls->current = uVar5;
        iVar6 = check_next(ls,".");
        if (iVar6 != 0) {
          iVar6 = check_next(ls,".");
          return 0x117 - (uint)(iVar6 == 0);
        }
        ppuVar9 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar9 + (long)ls->current * 2 + 1) & 8) == 0) {
          return 0x2e;
        }
LAB_0010b37e:
        read_numeral(ls,seminfo);
        return 0x11c;
      }
      if (uVar5 == 0x3c) {
        pZVar3 = ls->z;
        sVar1 = pZVar3->n;
        pZVar3->n = pZVar3->n - 1;
        if (sVar1 == 0) {
          uVar5 = luaZ_fill(pZVar3);
        }
        else {
          pbVar4 = (byte *)pZVar3->p;
          pZVar3->p = (char *)(pbVar4 + 1);
          uVar5 = (uint)*pbVar4;
        }
        ls->current = uVar5;
        if (uVar5 != 0x3d) {
          return 0x3c;
        }
        pZVar3 = ls->z;
        sVar1 = pZVar3->n;
        pZVar3->n = pZVar3->n - 1;
        if (sVar1 == 0) {
          uVar5 = luaZ_fill(pZVar3);
        }
        else {
          pbVar4 = (byte *)pZVar3->p;
          pZVar3->p = (char *)(pbVar4 + 1);
          uVar5 = (uint)*pbVar4;
        }
        ls->current = uVar5;
        return 0x11a;
      }
      if (uVar5 == 0x3d) {
        pZVar3 = ls->z;
        sVar1 = pZVar3->n;
        pZVar3->n = pZVar3->n - 1;
        if (sVar1 == 0) {
          uVar5 = luaZ_fill(pZVar3);
        }
        else {
          pbVar4 = (byte *)pZVar3->p;
          pZVar3->p = (char *)(pbVar4 + 1);
          uVar5 = (uint)*pbVar4;
        }
        ls->current = uVar5;
        if (uVar5 != 0x3d) {
          return 0x3d;
        }
        pZVar3 = ls->z;
        sVar1 = pZVar3->n;
        pZVar3->n = pZVar3->n - 1;
        if (sVar1 == 0) {
          uVar5 = luaZ_fill(pZVar3);
        }
        else {
          pbVar4 = (byte *)pZVar3->p;
          pZVar3->p = (char *)(pbVar4 + 1);
          uVar5 = (uint)*pbVar4;
        }
        ls->current = uVar5;
        return 0x118;
      }
      if (uVar5 == 0x3e) {
        pZVar3 = ls->z;
        sVar1 = pZVar3->n;
        pZVar3->n = pZVar3->n - 1;
        if (sVar1 == 0) {
          uVar5 = luaZ_fill(pZVar3);
        }
        else {
          pbVar4 = (byte *)pZVar3->p;
          pZVar3->p = (char *)(pbVar4 + 1);
          uVar5 = (uint)*pbVar4;
        }
        ls->current = uVar5;
        if (uVar5 != 0x3d) {
          return 0x3e;
        }
        pZVar3 = ls->z;
        sVar1 = pZVar3->n;
        pZVar3->n = pZVar3->n - 1;
        if (sVar1 == 0) {
          uVar5 = luaZ_fill(pZVar3);
        }
        else {
          pbVar4 = (byte *)pZVar3->p;
          pZVar3->p = (char *)(pbVar4 + 1);
          uVar5 = (uint)*pbVar4;
        }
        ls->current = uVar5;
        return 0x119;
      }
      if (uVar5 == 0x5b) {
        iVar6 = skip_sep(ls);
        if (-1 < iVar6) {
          read_long_string(ls,seminfo,iVar6);
          return 0x11e;
        }
        if (iVar6 == -1) {
          return 0x5b;
        }
        msg = "invalid long string delimiter";
        goto LAB_0010b42c;
      }
      if (uVar5 == 0xd) break;
      ppuVar9 = __ctype_b_loc();
      uVar2 = (*ppuVar9)[(int)uVar5];
      if ((uVar2 >> 0xd & 1) == 0) {
        if ((uVar2 >> 0xb & 1) == 0) {
          if ((uVar5 != 0x5f) && ((uVar2 & 0x400) == 0)) {
            pZVar3 = ls->z;
            sVar1 = pZVar3->n;
            pZVar3->n = pZVar3->n - 1;
            if (sVar1 == 0) {
              uVar8 = luaZ_fill(pZVar3);
            }
            else {
              pbVar4 = (byte *)pZVar3->p;
              pZVar3->p = (char *)(pbVar4 + 1);
              uVar8 = (uint)*pbVar4;
            }
            ls->current = uVar8;
            return uVar5;
          }
          do {
            save(ls,uVar5);
            pZVar3 = ls->z;
            sVar1 = pZVar3->n;
            pZVar3->n = pZVar3->n - 1;
            if (sVar1 == 0) {
              uVar5 = luaZ_fill(pZVar3);
            }
            else {
              pbVar4 = (byte *)pZVar3->p;
              pZVar3->p = (char *)(pbVar4 + 1);
              uVar5 = (uint)*pbVar4;
            }
            ls->current = uVar5;
          } while ((uVar5 == 0x5f) || (((*ppuVar9)[(int)uVar5] & 8) != 0));
          pTVar10 = luaX_newstring(ls,ls->buff->buffer,ls->buff->n);
          if ((pTVar10->tsv).reserved == 0) {
            seminfo->ts = pTVar10;
            return 0x11d;
          }
          return (pTVar10->tsv).reserved | 0x100;
        }
        goto LAB_0010b37e;
      }
      pZVar3 = ls->z;
      sVar1 = pZVar3->n;
      pZVar3->n = pZVar3->n - 1;
      if (sVar1 == 0) {
        uVar5 = luaZ_fill(pZVar3);
      }
      else {
        pbVar4 = (byte *)pZVar3->p;
        pZVar3->p = (char *)(pbVar4 + 1);
        uVar5 = (uint)*pbVar4;
      }
      ls->current = uVar5;
    }
    inclinenumber(ls);
  } while( true );
LAB_0010af33:
  if (uVar8 == uVar5) {
    save(ls,uVar5);
    pZVar3 = ls->z;
    sVar1 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar1 == 0) {
      uVar5 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar5 = (uint)*pbVar4;
    }
    ls->current = uVar5;
    pTVar10 = luaX_newstring(ls,ls->buff->buffer + 1,ls->buff->n - 2);
    seminfo->ts = pTVar10;
    return 0x11e;
  }
  if (uVar8 != 0x5c) {
    if ((uVar8 == 0xd) || (uVar8 == 10)) {
      msg = "unfinished string";
LAB_0010b42c:
      luaX_lexerror(ls,msg,0x11e);
    }
    if (uVar8 == 0xffffffff) {
      luaX_lexerror(ls,"unfinished string",0x11f);
    }
    save(ls,uVar8);
    pZVar3 = ls->z;
    sVar1 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar1 == 0) {
      uVar8 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar8 = (uint)*pbVar4;
    }
    ls->current = uVar8;
    goto LAB_0010af33;
  }
  pZVar3 = ls->z;
  sVar1 = pZVar3->n;
  pZVar3->n = pZVar3->n - 1;
  if (sVar1 == 0) {
    uVar8 = luaZ_fill(pZVar3);
  }
  else {
    pbVar4 = (byte *)pZVar3->p;
    pZVar3->p = (char *)(pbVar4 + 1);
    uVar8 = (uint)*pbVar4;
  }
  ls->current = uVar8;
  iVar6 = 10;
  switch(uVar8) {
  case 0x6e:
    break;
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x73:
  case 0x75:
switchD_0010b005_caseD_6f:
    ppuVar9 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar9 + (long)(int)uVar8 * 2 + 1) & 8) == 0) {
      save(ls,uVar8);
      pZVar3 = ls->z;
      sVar1 = pZVar3->n;
      pZVar3->n = pZVar3->n - 1;
      goto joined_r0x0010b04d;
    }
    c = 0;
    iVar6 = 3;
    do {
      pZVar3 = ls->z;
      sVar1 = pZVar3->n;
      pZVar3->n = pZVar3->n - 1;
      if (sVar1 == 0) {
        uVar7 = luaZ_fill(pZVar3);
      }
      else {
        pbVar4 = (byte *)pZVar3->p;
        pZVar3->p = (char *)(pbVar4 + 1);
        uVar7 = (uint)*pbVar4;
      }
      c = uVar8 + c * 10 + -0x30;
      ls->current = uVar7;
      iVar6 = iVar6 + -1;
    } while ((iVar6 != 0) &&
            (uVar8 = uVar7, (*(byte *)((long)*ppuVar9 + (long)(int)uVar7 * 2 + 1) & 8) != 0));
    if (c < 0x100) {
      save(ls,c);
      goto LAB_0010b088;
    }
    msg = "escape sequence too large";
    goto LAB_0010b42c;
  case 0x72:
    iVar6 = 0xd;
    break;
  case 0x74:
    iVar6 = 9;
    break;
  case 0x76:
    iVar6 = 0xb;
    break;
  default:
    if (uVar8 != 0xffffffff) {
      if ((uVar8 != 10) && (uVar8 != 0xd)) {
        iVar6 = 7;
        if (uVar8 != 0x61) {
          if (uVar8 == 0x66) {
            iVar6 = 0xc;
          }
          else {
            if (uVar8 != 0x62) goto switchD_0010b005_caseD_6f;
            iVar6 = 8;
          }
        }
        break;
      }
      save(ls,10);
      inclinenumber(ls);
    }
    goto LAB_0010b088;
  }
  save(ls,iVar6);
  pZVar3 = ls->z;
  sVar1 = pZVar3->n;
  pZVar3->n = pZVar3->n - 1;
joined_r0x0010b04d:
  if (sVar1 == 0) {
    uVar8 = luaZ_fill(pZVar3);
  }
  else {
    pbVar4 = (byte *)pZVar3->p;
    pZVar3->p = (char *)(pbVar4 + 1);
    uVar8 = (uint)*pbVar4;
  }
  ls->current = uVar8;
LAB_0010b088:
  uVar8 = ls->current;
  goto LAB_0010af33;
}

Assistant:

static int llex(LexState*ls,SemInfo*seminfo){
luaZ_resetbuffer(ls->buff);
for(;;){
switch(ls->current){
case'\n':
case'\r':{
inclinenumber(ls);
continue;
}
case'-':{
next(ls);
if(ls->current!='-')return'-';
next(ls);
if(ls->current=='['){
int sep=skip_sep(ls);
luaZ_resetbuffer(ls->buff);
if(sep>=0){
read_long_string(ls,NULL,sep);
luaZ_resetbuffer(ls->buff);
continue;
}
}
while(!currIsNewline(ls)&&ls->current!=(-1))
next(ls);
continue;
}
case'[':{
int sep=skip_sep(ls);
if(sep>=0){
read_long_string(ls,seminfo,sep);
return TK_STRING;
}
else if (sep!=-1)luaX_lexerror(ls,"invalid long string delimiter",TK_STRING);
return'[';
}
case'=':{
next(ls);
if(ls->current!='=')return'=';
else{next(ls);return TK_EQ;}
}
case'<':{
next(ls);
if(ls->current!='=')return'<';
else{next(ls);return TK_LE;}
}
case'>':{
next(ls);
if(ls->current!='=')return'>';
else{next(ls);return TK_GE;}
}
case'~':{
next(ls);
if(ls->current!='=')return'~';
else{next(ls);return TK_NE;}
}
case'"':
case'\'':{
read_string(ls,ls->current,seminfo);
return TK_STRING;
}
case'.':{
save_and_next(ls);
if(check_next(ls,".")){
if(check_next(ls,"."))
return TK_DOTS;
else return TK_CONCAT;
}
else if(!isdigit(ls->current))return'.';
else{
read_numeral(ls,seminfo);
return TK_NUMBER;
}
}
case(-1):{
return TK_EOS;
}
default:{
if(isspace(ls->current)){
next(ls);
continue;
}
else if(isdigit(ls->current)){
read_numeral(ls,seminfo);
return TK_NUMBER;
}
else if(isalpha(ls->current)||ls->current=='_'){
TString*ts;
do{
save_and_next(ls);
}while(isalnum(ls->current)||ls->current=='_');
ts=luaX_newstring(ls,luaZ_buffer(ls->buff),
luaZ_bufflen(ls->buff));
if(ts->tsv.reserved>0)
return ts->tsv.reserved-1+257;
else{
seminfo->ts=ts;
return TK_NAME;
}
}
else{
int c=ls->current;
next(ls);
return c;
}
}
}
}
}